

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

bool __thiscall llvm::sys::SmartMutex<true>::unlock(SmartMutex<true> *this)

{
  bool bVar1;
  SmartMutex<true> *this_local;
  
  bVar1 = llvm_is_multithreaded();
  if (bVar1) {
    this_local._7_1_ = MutexImpl::release(&this->impl);
  }
  else {
    if ((((this->recursive & 1U) != 0) && (this->acquired != 0)) ||
       (bVar1 = false, this->acquired == 1)) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("((recursive && acquired) || (acquired == 1)) && \"Lock not acquired before release!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Mutex.h"
                    ,0x79,"bool llvm::sys::SmartMutex<true>::unlock() [mt_only = true]");
    }
    this->acquired = this->acquired - 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool unlock() {
        if (!mt_only || llvm_is_multithreaded()) {
          return impl.release();
        } else {
          // Single-threaded debugging code.  This would be racy in
          // multithreaded mode, but provides not sanity checks in single
          // threaded mode.
          assert(((recursive && acquired) || (acquired == 1)) &&
                 "Lock not acquired before release!");
          --acquired;
          return true;
        }
      }